

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

SNode * goto_PNode(Parser *p,d_loc_t *loc,PNode *pn,SNode *ps)

{
  uint32 *puVar1;
  uint uVar2;
  PNode *pn_00;
  D_Reduction *reduction;
  ZNode *z;
  SNode **ppSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  SNode *pSVar6;
  ZNode *z_00;
  D_State *pDVar7;
  SNode *pSVar8;
  Reduction *pRVar9;
  SNode *extraout_RAX;
  uint uVar10;
  ulong uVar11;
  SNode *pSVar12;
  ulong uVar13;
  D_RightEpsilonHint *pDVar14;
  uint uVar15;
  bool bVar16;
  
  uVar2 = (pn->parse_node).symbol;
  pSVar6 = (SNode *)(long)(int)uVar2;
  uVar15 = uVar2 + 7;
  if (-1 < (long)pSVar6) {
    uVar15 = uVar2;
  }
  if ((ps->state->goto_valid[(int)uVar15 >> 3] >> (uVar2 & 7) & 1) == 0) {
    return pSVar6;
  }
  pSVar6 = add_SNode(p,p->t->state +
                       (p->t->goto_table[(long)pSVar6 - (long)ps->state->goto_table_offset] - 1),loc
                     ,(pn->parse_node).scope);
  pn_00 = pSVar6->last_pn;
  if (pn_00 != (PNode *)0x0) {
    puVar1 = &pn_00->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pn_00);
    }
  }
  pn->refcount = pn->refcount + 1;
  pSVar6->last_pn = pn;
  if (pSVar6 != ps) {
    if ((*(uint *)&pSVar6->field_0x24 & 0x7fffffff) <= (*(uint *)&ps->field_0x24 & 0x7fffffff)) {
      *(uint *)&pSVar6->field_0x24 =
           *(uint *)&pSVar6->field_0x24 & 0x80000000 | *(uint *)&ps->field_0x24 + 1 & 0x7fffffff;
    }
  }
  uVar2 = (pSVar6->zns).n;
  uVar13 = CONCAT44(0,uVar2);
  if (uVar13 < 4) {
    if (uVar13 != 0) {
      uVar11 = 0;
      do {
        z_00 = (pSVar6->zns).v[uVar11];
        if (z_00->pn == pn) goto LAB_00145fc0;
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar13;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pn;
    uVar13 = SUB168(auVar5 % auVar4,0);
    if (SUB164(auVar5 % auVar4,0) < uVar2) {
      uVar15 = 0;
      while( true ) {
        z_00 = (pSVar6->zns).v[uVar13];
        if (z_00 == (ZNode *)0x0) break;
        if (z_00->pn == pn) goto LAB_00145fc0;
        uVar10 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar10;
        if (uVar10 == uVar2) {
          uVar13 = 0;
        }
        if ((uVar2 <= (uint)uVar13) || (bVar16 = 3 < uVar15, uVar15 = uVar15 + 1, bVar16)) break;
      }
    }
  }
  z_00 = new_ZNode(p,pn);
  set_add_znode(&pSVar6->zns,z_00);
  pDVar7 = pSVar6->state;
  if ((pDVar7->reductions).n != 0) {
    uVar13 = 0;
    do {
      reduction = (pDVar7->reductions).v[uVar13];
      if (reduction->nelements != 0) {
        add_Reduction(p,z_00,pSVar6,reduction);
        pDVar7 = pSVar6->state;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (pDVar7->reductions).n);
  }
  if ((pn->shift == (D_Shift *)0x0) && ((pDVar7->right_epsilon_hints).n != 0)) {
    uVar13 = 0;
    do {
      pDVar14 = (pDVar7->right_epsilon_hints).v;
      pSVar8 = find_SNode(p,(uint)pDVar14[uVar13].preceeding_state,pSVar6->initial_scope);
      if ((pSVar8 != (SNode *)0x0) && ((pSVar8->zns).n != 0)) {
        pDVar14 = pDVar14 + uVar13;
        uVar11 = 0;
        do {
          z = (pSVar8->zns).v[uVar11];
          if ((z != (ZNode *)0x0) &&
             (pRVar9 = add_Reduction(p,z,pSVar8,(D_Reduction *)pDVar14->reduction),
             pRVar9 != (Reduction *)0x0)) {
            pRVar9->new_snode = pSVar6;
            pRVar9->new_depth = (uint)pDVar14->depth;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (pSVar8->zns).n);
      }
      uVar13 = uVar13 + 1;
      pDVar7 = pSVar6->state;
    } while (uVar13 < (pDVar7->right_epsilon_hints).n);
  }
LAB_00145fc0:
  uVar2 = (z_00->sns).n;
  pSVar8 = (SNode *)(ulong)uVar2;
  ppSVar3 = (z_00->sns).v;
  if (pSVar8 == (SNode *)0x0) {
    if (ppSVar3 == (SNode **)0x0) {
      (z_00->sns).v = (z_00->sns).e;
      (z_00->sns).n = 1;
      (z_00->sns).e[0] = ps;
      goto LAB_00146026;
    }
    if (ppSVar3 != (z_00->sns).e) goto LAB_00146007;
  }
  else {
    pSVar12 = (SNode *)0x0;
    do {
      if (ppSVar3[(long)pSVar12] == ps) {
        return pSVar8;
      }
      pSVar12 = (SNode *)((long)&(pSVar12->loc).s + 1);
    } while (pSVar8 != pSVar12);
    if (ppSVar3 == (z_00->sns).e) {
      if (2 < uVar2) goto LAB_00146007;
    }
    else if ((uVar2 & 7) == 0) {
LAB_00146007:
      vec_add_internal(&z_00->sns,ps);
      pSVar8 = extraout_RAX;
      goto LAB_00146026;
    }
  }
  (z_00->sns).n = uVar2 + 1;
  ppSVar3[(long)pSVar8] = ps;
LAB_00146026:
  if (pSVar6 != ps) {
    ps->refcount = ps->refcount + 1;
  }
  return pSVar8;
}

Assistant:

static SNode *goto_PNode(Parser *p, d_loc_t *loc, PNode *pn, SNode *ps) {
  SNode *new_ps, *pre_ps;
  ZNode *z = NULL;
  D_State *state;
  uint i, j, k, state_index;

  if (!IS_BIT_SET(ps->state->goto_valid, pn->parse_node.symbol)) return NULL;
  state_index = GOTO_STATE(p, pn, ps);
  state = &p->t->state[state_index];
  new_ps = add_SNode(p, state, loc, pn->parse_node.scope);
  if (new_ps->last_pn) unref_pn(p, new_ps->last_pn);
  ref_pn(pn);
  new_ps->last_pn = pn;

  DBG(printf("goto %d (%s) -> %d %p\n", (int)(ps->state - p->t->state), p->t->symbols[pn->parse_node.symbol].name,
             state_index, (void *)new_ps));
  if (ps != new_ps && new_ps->depth < ps->depth + 1) new_ps->depth = ps->depth + 1;
  /* find/create ZNode */
  z = set_find_znode(&new_ps->zns, pn);
  if (!z) { /* not found */
    set_add_znode(&new_ps->zns, (z = new_ZNode(p, pn)));
    for (j = 0; j < new_ps->state->reductions.n; j++)
      if (new_ps->state->reductions.v[j]->nelements) add_Reduction(p, z, new_ps, new_ps->state->reductions.v[j]);
    if (!pn->shift)
      for (j = 0; j < new_ps->state->right_epsilon_hints.n; j++) {
        D_RightEpsilonHint *h = &new_ps->state->right_epsilon_hints.v[j];
        pre_ps = find_SNode(p, h->preceeding_state, new_ps->initial_scope);
        if (!pre_ps) continue;
        for (k = 0; k < pre_ps->zns.n; k++)
          if (pre_ps->zns.v[k]) {
            Reduction *r = add_Reduction(p, pre_ps->zns.v[k], pre_ps, h->reduction);
            if (r) {
              r->new_snode = new_ps;
              r->new_depth = h->depth;
            }
          }
      }
  }
  for (i = 0; i < z->sns.n; i++)
    if (z->sns.v[i] == ps) break;
  if (i >= z->sns.n) { /* not found */
    vec_add(&z->sns, ps);
    if (new_ps != ps) ref_sn(ps);
  }
  return new_ps;
}